

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O2

string * __thiscall
polyscope::SurfaceVertexTangentVectorQuantity::niceName_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceVertexTangentVectorQuantity *this)

{
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->super_TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity>).nSym == 1)
  {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_SurfaceVectorQuantity).field_0x148," (vertex tangent vector)");
  }
  else {
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_SurfaceVectorQuantity).field_0x148," (vertex tangent vector sym=");
    std::__cxx11::to_string
              (&local_70,
               (this->super_TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity>).
               nSym);
    std::operator+(&local_30,&local_50,&local_70);
    std::operator+(__return_storage_ptr__,&local_30,")");
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceVertexTangentVectorQuantity::niceName() {
  if (nSym == 1) {
    return name + " (vertex tangent vector)";
  } else {
    return name + " (vertex tangent vector sym=" + std::to_string(nSym) + ")";
  }
}